

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O1

void icu_63::set32x64Bits(uint32_t *table,int32_t start,int32_t limit)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  iVar6 = start >> 6;
  uVar7 = 1 << ((byte)iVar6 & 0x1f);
  uVar2 = start & 0x3f;
  uVar3 = (ulong)uVar2;
  if (start + 1 != limit) {
    iVar1 = limit >> 6;
    uVar5 = limit & 0x3f;
    if (iVar6 == iVar1) {
      if (uVar2 < uVar5) {
        do {
          table[uVar3] = table[uVar3] | uVar7;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
    }
    else {
      if (uVar2 != 0) {
        do {
          table[uVar3] = table[uVar3] | uVar7;
          uVar3 = uVar3 + 1;
        } while (uVar3 != 0x40);
        iVar6 = iVar6 + 1;
      }
      if (iVar6 < iVar1) {
        uVar2 = ~(-1 << ((byte)iVar1 & 0x1f));
        if (0x1f < iVar1) {
          uVar2 = 0xffffffff;
        }
        lVar4 = 0;
        do {
          table[lVar4] = table[lVar4] | (uVar2 >> ((byte)iVar6 & 0x1f)) << ((byte)iVar6 & 0x1f);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x40);
      }
      uVar2 = 0x80000000;
      if (iVar1 != 0x20) {
        uVar2 = 1 << ((byte)iVar1 & 0x1f);
      }
      if (uVar5 != 0) {
        uVar3 = 0;
        do {
          table[uVar3] = table[uVar3] | uVar2;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
    }
    return;
  }
  table[uVar3] = table[uVar3] | uVar7;
  return;
}

Assistant:

static void set32x64Bits(uint32_t table[64], int32_t start, int32_t limit) {
    U_ASSERT(start<limit);
    U_ASSERT(limit<=0x800);

    int32_t lead=start>>6;  // Named for UTF-8 2-byte lead byte with upper 5 bits.
    int32_t trail=start&0x3f;  // Named for UTF-8 2-byte trail byte with lower 6 bits.

    // Set one bit indicating an all-one block.
    uint32_t bits=(uint32_t)1<<lead;
    if((start+1)==limit) {  // Single-character shortcut.
        table[trail]|=bits;
        return;
    }

    int32_t limitLead=limit>>6;
    int32_t limitTrail=limit&0x3f;

    if(lead==limitLead) {
        // Partial vertical bit column.
        while(trail<limitTrail) {
            table[trail++]|=bits;
        }
    } else {
        // Partial vertical bit column,
        // followed by a bit rectangle,
        // followed by another partial vertical bit column.
        if(trail>0) {
            do {
                table[trail++]|=bits;
            } while(trail<64);
            ++lead;
        }
        if(lead<limitLead) {
            bits=~(((unsigned)1<<lead)-1);
            if(limitLead<0x20) {
                bits&=((unsigned)1<<limitLead)-1;
            }
            for(trail=0; trail<64; ++trail) {
                table[trail]|=bits;
            }
        }
        // limit<=0x800. If limit==0x800 then limitLead=32 and limitTrail=0.
        // In that case, bits=1<<limitLead is undefined but the bits value
        // is not used because trail<limitTrail is already false.
        bits=(uint32_t)1<<((limitLead == 0x20) ? (limitLead - 1) : limitLead);
        for(trail=0; trail<limitTrail; ++trail) {
            table[trail]|=bits;
        }
    }
}